

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O2

void __thiscall
spvtools::opt::SSAPropagator::SSAPropagator
          (SSAPropagator *this,IRContext *context,VisitFunction *visit_fn)

{
  _Rb_tree_header *p_Var1;
  
  this->ctx_ = context;
  std::
  function<spvtools::opt::SSAPropagator::PropStatus_(spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_**)>
  ::function(&this->visit_fn_,visit_fn);
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            (&this->ssa_edge_uses_);
  std::
  queue<spvtools::opt::BasicBlock*,std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
  ::queue<std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>,void>
            (&this->blocks_);
  (this->simulated_blocks_)._M_h._M_buckets = &(this->simulated_blocks_)._M_h._M_single_bucket;
  (this->simulated_blocks_)._M_h._M_bucket_count = 1;
  (this->simulated_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->simulated_blocks_)._M_h._M_element_count = 0;
  (this->simulated_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->simulated_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->simulated_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->do_not_simulate_)._M_h._M_buckets = &(this->do_not_simulate_)._M_h._M_single_bucket;
  (this->do_not_simulate_)._M_h._M_bucket_count = 1;
  (this->do_not_simulate_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->do_not_simulate_)._M_h._M_element_count = 0;
  (this->do_not_simulate_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->do_not_simulate_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->do_not_simulate_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bb_preds_)._M_h._M_buckets = &(this->bb_preds_)._M_h._M_single_bucket;
  (this->bb_preds_)._M_h._M_bucket_count = 1;
  (this->bb_preds_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bb_preds_)._M_h._M_element_count = 0;
  (this->bb_preds_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bb_preds_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bb_preds_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->bb_succs_)._M_h._M_buckets = &(this->bb_succs_)._M_h._M_single_bucket;
  (this->bb_succs_)._M_h._M_bucket_count = 1;
  (this->bb_succs_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bb_succs_)._M_h._M_element_count = 0;
  (this->bb_succs_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bb_succs_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bb_succs_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->executable_edges_)._M_t._M_impl.super__Rb_tree_header;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->executable_edges_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->statuses_)._M_h._M_buckets = &(this->statuses_)._M_h._M_single_bucket;
  (this->statuses_)._M_h._M_bucket_count = 1;
  (this->statuses_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->statuses_)._M_h._M_element_count = 0;
  (this->statuses_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->statuses_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->statuses_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

SSAPropagator(IRContext* context, const VisitFunction& visit_fn)
      : ctx_(context), visit_fn_(visit_fn) {}